

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_1.h
# Opt level: O2

void __thiscall
dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
          (queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          file *item)

{
  unsigned_long uVar1;
  node *pnVar2;
  node *pnVar3;
  
  pnVar2 = (node *)operator_new(0x58);
  file::file(&pnVar2->item);
  std::swap<dlib::file::data>(&item->state,&(pnVar2->item).state);
  uVar1 = this->queue_size;
  if (uVar1 == 0) {
    pnVar3 = (node *)&this->out;
  }
  else {
    pnVar3 = this->in;
  }
  pnVar3->last = pnVar2;
  this->in = pnVar2;
  this->queue_size = uVar1 + 1;
  (*(this->super_enumerable<dlib::file>)._vptr_enumerable[3])(this);
  return;
}

Assistant:

void queue_kernel_1<T,mem_manager>::
    enqueue (
        T& item
    )
    {
        // make new node
        node* temp = new node;

        // swap item into new node
        exchange(item,temp->item);
        
        if (queue_size == 0)
            out = temp;
        else
            in->last = temp;

        // make in point to the new node
        in = temp;
        
        ++queue_size;

        // put the enumerator at the start
        reset();
    }